

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_event_thread.c
# Opt level: O3

void ares_event_thread_destroy_int(ares_event_thread_t *e)

{
  ares_event_t *paVar1;
  void *in_RAX;
  void *rv;
  void *local_18;
  
  local_18 = in_RAX;
  ares_thread_mutex_lock(e->mutex);
  if (e->isup != ARES_FALSE) {
    e->isup = ARES_FALSE;
    paVar1 = e->ev_signal;
    if ((paVar1 != (ares_event_t *)0x0) && (paVar1->signal_cb != (ares_event_signal_cb_t)0x0)) {
      (*paVar1->signal_cb)(paVar1);
    }
  }
  ares_thread_mutex_unlock(e->mutex);
  if (e->thread != (ares_thread_t *)0x0) {
    local_18 = (void *)0x0;
    ares_thread_join(e->thread,&local_18);
    e->thread = (ares_thread_t *)0x0;
  }
  ares_event_thread_cleanup(e);
  ares_thread_mutex_destroy(e->mutex);
  e->mutex = (ares_thread_mutex_t *)0x0;
  ares_free(e);
  return;
}

Assistant:

static void ares_event_thread_destroy_int(ares_event_thread_t *e)
{
  /* Wake thread and tell it to shutdown if it exists */
  ares_thread_mutex_lock(e->mutex);
  if (e->isup) {
    e->isup = ARES_FALSE;
    ares_event_thread_wake(e);
  }
  ares_thread_mutex_unlock(e->mutex);

  /* Wait for thread to shutdown */
  if (e->thread) {
    void *rv = NULL;
    ares_thread_join(e->thread, &rv);
    e->thread = NULL;
  }

  /* If the event thread ever got to the point of starting, this is a no-op
   * as it runs this same cleanup when it shuts down */
  ares_event_thread_cleanup(e);

  ares_thread_mutex_destroy(e->mutex);
  e->mutex = NULL;

  ares_free(e);
}